

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_GccFormatErrors_Test::
CommandLineInterfaceTest_GccFormatErrors_Test(CommandLineInterfaceTest_GccFormatErrors_Test *this)

{
  CommandLineInterfaceTest_GccFormatErrors_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTest_GccFormatErrors_Test_029fd800;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GccFormatErrors) {
  // Test --error_format=gcc (which is the default, but we want to verify
  // that it can be set explicitly).

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "badsyntax\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir --error_format=gcc foo.proto");

  ExpectErrorText(
      "foo.proto:2:1: Expected top-level statement (e.g. \"message\").\n");
}